

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

string * SpellSerialize(string *__return_storage_ptr__,
                       list<Character_Spell,_std::allocator<Character_Spell>_> *list)

{
  byte bVar1;
  int in_EDX;
  int subject;
  int extraout_EDX;
  _List_node_base *p_Var2;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var2 = (_List_node_base *)list;
  while (p_Var2 = (((_List_base<Character_Spell,_std::allocator<Character_Spell>_> *)
                   &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)list) {
    bVar1 = *(undefined1 *)((long)&p_Var2[1]._M_next + 2);
    util::to_string_abi_cxx11_
              (&local_50,(util *)(ulong)(uint)(int)*(short *)&p_Var2[1]._M_next,in_EDX);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    util::to_string_abi_cxx11_(&local_50,(util *)(ulong)bVar1,subject);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    in_EDX = extraout_EDX;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SpellSerialize(const std::list<Character_Spell> &list)
{
	std::string serialized;

	UTIL_FOREACH(list, spell)
	{
		serialized.append(util::to_string(spell.id));
		serialized.append(",");
		serialized.append(util::to_string(spell.level));
		serialized.append(";");
	}

	return serialized;
}